

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptorTables * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateFileTables(Tables *this)

{
  pointer *ppuVar1;
  iterator __position;
  FileDescriptorTables *this_00;
  FileDescriptorTables *result;
  _Head_base<0UL,_google::protobuf::FileDescriptorTables_*,_false> local_18;
  
  this_00 = (FileDescriptorTables *)operator_new(0x1d8);
  FileDescriptorTables::FileDescriptorTables(this_00);
  __position._M_current =
       (this->file_tables_).
       super__Vector_base<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>,_std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_18._M_head_impl = this_00;
  if (__position._M_current ==
      (this->file_tables_).
      super__Vector_base<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>,_std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>>>
    ::_M_realloc_insert<google::protobuf::FileDescriptorTables*&>
              ((vector<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>,std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,std::default_delete<google::protobuf::FileDescriptorTables>>>>
                *)&this->file_tables_,__position,&local_18._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::FileDescriptorTables_*,_std::default_delete<google::protobuf::FileDescriptorTables>_>
    .super__Head_base<0UL,_google::protobuf::FileDescriptorTables_*,_false>._M_head_impl = this_00;
    ppuVar1 = &(this->file_tables_).
               super__Vector_base<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>,_std::allocator<std::unique_ptr<google::protobuf::FileDescriptorTables,_std::default_delete<google::protobuf::FileDescriptorTables>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return local_18._M_head_impl;
}

Assistant:

FileDescriptorTables* DescriptorPool::Tables::AllocateFileTables() {
  FileDescriptorTables* result = new FileDescriptorTables;
  file_tables_.emplace_back(result);
  return result;
}